

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_mllr.c
# Opt level: O2

ps_mllr_t * ps_mllr_read(char *regmatfile)

{
  int iVar1;
  ps_mllr_t *mllr;
  FILE *__stream;
  int *piVar2;
  float32 ****ppppfVar3;
  float32 ***pppfVar4;
  float32 **ppfVar5;
  char *pcVar6;
  long lVar7;
  undefined4 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lStackY_60;
  int n;
  long local_38;
  
  mllr = (ps_mllr_t *)
         __ckd_calloc__(1,0x38,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                        ,0x36);
  mllr->refcnt = 1;
  __stream = fopen(regmatfile,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                   ,0x3a,"Failed to open MLLR file \'%s\' for reading",regmatfile);
    goto LAB_0013c143;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
          ,0x3e,"Reading MLLR transformation file \'%s\'\n",regmatfile);
  iVar1 = __isoc99_fscanf(__stream,"%d",&n);
  if (n < 1 || iVar1 != 1) {
    pcVar6 = "Failed to read number of MLLR classes\n";
    lStackY_60 = 0x41;
LAB_0013c102:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
            ,lStackY_60,pcVar6);
  }
  else {
    mllr->n_class = n;
    iVar1 = __isoc99_fscanf(__stream,"%d",&n);
    if (iVar1 != 1) {
      pcVar6 = "Failed to read number of feature streams\n";
      lStackY_60 = 0x47;
      goto LAB_0013c102;
    }
    mllr->n_feat = n;
    piVar2 = (int *)__ckd_calloc__((long)n,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                   ,0x4b);
    mllr->veclen = piVar2;
    ppppfVar3 = (float32 ****)
                __ckd_calloc__((long)mllr->n_feat,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                               ,0x4d);
    mllr->A = ppppfVar3;
    pppfVar4 = (float32 ***)
               __ckd_calloc__((long)mllr->n_feat,8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                              ,0x4e);
    mllr->b = pppfVar4;
    pppfVar4 = (float32 ***)
               __ckd_calloc__((long)mllr->n_feat,8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                              ,0x4f);
    mllr->h = pppfVar4;
    uVar12 = 0;
    while( true ) {
      if ((long)mllr->n_feat <= (long)uVar12) {
        fclose(__stream);
        return mllr;
      }
      iVar1 = __isoc99_fscanf(__stream,"%d",&n);
      if (iVar1 != 1) break;
      mllr->veclen[uVar12] = n;
      pppfVar4 = (float32 ***)
                 __ckd_calloc_3d__((long)mllr->n_class,(long)n,(long)n,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                   ,0x59);
      mllr->A[uVar12] = pppfVar4;
      ppfVar5 = (float32 **)
                __ckd_calloc_2d__((long)mllr->n_class,(long)mllr->veclen[uVar12],4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                  ,0x5c);
      mllr->b[uVar12] = ppfVar5;
      ppfVar5 = (float32 **)
                __ckd_calloc_2d__((long)mllr->n_class,(long)mllr->veclen[uVar12],4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                  ,0x5f);
      mllr->h[uVar12] = ppfVar5;
      for (lVar7 = 0; lVar7 < mllr->n_class; lVar7 = lVar7 + 1) {
        iVar1 = mllr->veclen[uVar12];
        local_38 = lVar7;
        for (lVar10 = 0; lVar10 < iVar1; lVar10 = lVar10 + 1) {
          lVar11 = 0;
          for (lVar9 = 0; lVar9 < iVar1; lVar9 = lVar9 + 1) {
            iVar1 = __isoc99_fscanf(__stream,"%f ",(long)mllr->A[uVar12][lVar7][lVar10] + lVar11);
            if (iVar1 != 1) {
              uVar8 = (undefined4)lVar10;
              pcVar6 = "Failed reading MLLR rotation (%d,%d,%d,%d)\n";
              lStackY_60 = 0x66;
              goto LAB_0013c128;
            }
            iVar1 = mllr->veclen[uVar12];
            lVar11 = lVar11 + 4;
            lVar7 = local_38;
          }
        }
        lVar9 = 0;
        lVar10 = 0;
LAB_0013c03d:
        if (lVar10 < iVar1) {
          iVar1 = __isoc99_fscanf(__stream,"%f ",(long)mllr->b[uVar12][lVar7] + lVar9);
          if (iVar1 == 1) goto code_r0x0013c06e;
          uVar8 = (undefined4)lVar10;
          pcVar6 = "Failed reading MLLR bias (%d,%d,%d)\n";
          lStackY_60 = 0x6e;
LAB_0013c128:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                  ,lStackY_60,pcVar6,uVar12 & 0xffffffff,local_38,uVar8);
          goto LAB_0013c13b;
        }
        lVar9 = 0;
        for (lVar10 = 0; lVar10 < iVar1; lVar10 = lVar10 + 1) {
          iVar1 = __isoc99_fscanf(__stream,"%f ",(long)mllr->h[uVar12][lVar7] + lVar9);
          if (iVar1 != 1) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                    ,0x75,"Failed reading MLLR variance scale (%d,%d,%d)\n",uVar12 & 0xffffffff,
                    local_38,(int)lVar10);
            goto LAB_0013c13b;
          }
          iVar1 = mllr->veclen[uVar12];
          lVar9 = lVar9 + 4;
          lVar7 = local_38;
        }
      }
      uVar12 = uVar12 + 1;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
            ,0x53,"Failed to read stream length for feature %d\n",uVar12 & 0xffffffff);
  }
LAB_0013c13b:
  fclose(__stream);
LAB_0013c143:
  ps_mllr_free(mllr);
  return (ps_mllr_t *)0x0;
code_r0x0013c06e:
  lVar10 = lVar10 + 1;
  iVar1 = mllr->veclen[uVar12];
  lVar9 = lVar9 + 4;
  lVar7 = local_38;
  goto LAB_0013c03d;
}

Assistant:

ps_mllr_t *
ps_mllr_read(char const *regmatfile)
{
    ps_mllr_t *mllr;
    FILE *fp;
    int n, i, m, j, k;

    mllr = ckd_calloc(1, sizeof(*mllr));
    mllr->refcnt = 1;

    if ((fp = fopen(regmatfile, "r")) == NULL) {
        E_ERROR_SYSTEM("Failed to open MLLR file '%s' for reading", regmatfile);
        goto error_out;
    }
    else
        E_INFO("Reading MLLR transformation file '%s'\n", regmatfile);

    if ((fscanf(fp, "%d", &n) != 1) || (n < 1)) {
        E_ERROR("Failed to read number of MLLR classes\n");
        goto error_out;
    }
    mllr->n_class = n;

    if ((fscanf(fp, "%d", &n) != 1)) {
        E_ERROR("Failed to read number of feature streams\n");
        goto error_out;
    }
    mllr->n_feat = n;
    mllr->veclen = ckd_calloc(mllr->n_feat, sizeof(*mllr->veclen));

    mllr->A = (float32 ****) ckd_calloc(mllr->n_feat, sizeof(float32 **));
    mllr->b = (float32 ***) ckd_calloc(mllr->n_feat, sizeof(float32 *));
    mllr->h = (float32 ***) ckd_calloc(mllr->n_feat, sizeof(float32 *));

    for (i = 0; i < mllr->n_feat; ++i) {
        if (fscanf(fp, "%d", &n) != 1) {
            E_ERROR("Failed to read stream length for feature %d\n", i);
            goto error_out;
        }
        mllr->veclen[i] = n;
        mllr->A[i] =
            (float32 ***) ckd_calloc_3d(mllr->n_class, mllr->veclen[i],
                                        mllr->veclen[i], sizeof(float32));
        mllr->b[i] =
            (float32 **) ckd_calloc_2d(mllr->n_class, mllr->veclen[i],
                                       sizeof(float32));
        mllr->h[i] =
            (float32 **) ckd_calloc_2d(mllr->n_class, mllr->veclen[i],
                                       sizeof(float32));

        for (m = 0; m < mllr->n_class; ++m) {
            for (j = 0; j < mllr->veclen[i]; ++j) {
                for (k = 0; k < mllr->veclen[i]; ++k) {
                    if (fscanf(fp, "%f ", &mllr->A[i][m][j][k]) != 1) {
                        E_ERROR("Failed reading MLLR rotation (%d,%d,%d,%d)\n",
                                i, m, j, k);
                        goto error_out;
                    }
                }
            }
            for (j = 0; j < mllr->veclen[i]; ++j) {
                if (fscanf(fp, "%f ", &mllr->b[i][m][j]) != 1) {
                    E_ERROR("Failed reading MLLR bias (%d,%d,%d)\n",
                            i, m, j);
                    goto error_out;
                }
            }
            for (j = 0; j < mllr->veclen[i]; ++j) {
                if (fscanf(fp, "%f ", &mllr->h[i][m][j]) != 1) {
                    E_ERROR("Failed reading MLLR variance scale (%d,%d,%d)\n",
                            i, m, j);
                    goto error_out;
                }
            }
        }
    }
    fclose(fp);
    return mllr;

error_out:
    if (fp)
        fclose(fp);
    ps_mllr_free(mllr);
    return NULL;
}